

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O0

ES5ArrayTypeHandler * __thiscall
Js::DeferredTypeHandlerBase::ConvertToES5ArrayType
          (DeferredTypeHandlerBase *this,DynamicObject *instance,int initSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar4;
  ScriptContext *pSVar5;
  ES5ArrayTypeHandler *newTypeHandler;
  int initSlotCapacity_local;
  DynamicObject *instance_local;
  DeferredTypeHandlerBase *this_local;
  
  if (0xfffe < initSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                ,0xac,
                                "(initSlotCapacity <= ES5ArrayTypeHandler::MaxPropertyIndexSize)",
                                "initSlotCapacity <= ES5ArrayTypeHandler::MaxPropertyIndexSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pEVar4 = ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
                     (this,instance,initSlotCapacity,0);
  pSVar5 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar5->convertDeferredToDictionaryCount = pSVar5->convertDeferredToDictionaryCount + 1;
  return pEVar4;
}

Assistant:

ES5ArrayTypeHandler* DeferredTypeHandlerBase::ConvertToES5ArrayType(DynamicObject* instance, int initSlotCapacity)
    {
        // DeferredTypeHandler is only used internally by the type system. "initSlotCapacity" should be a tiny number.
        Assert(initSlotCapacity <= ES5ArrayTypeHandler::MaxPropertyIndexSize);

        ES5ArrayTypeHandler* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandler>(instance, initSlotCapacity);

    #ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertDeferredToDictionaryCount++;
    #endif
        return newTypeHandler;
    }